

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001f3c80 = 0x2d2d2d2d2d2d2d;
    uRam00000000001f3c87._0_1_ = '-';
    uRam00000000001f3c87._1_1_ = '-';
    uRam00000000001f3c87._2_1_ = '-';
    uRam00000000001f3c87._3_1_ = '-';
    uRam00000000001f3c87._4_1_ = '-';
    uRam00000000001f3c87._5_1_ = '-';
    uRam00000000001f3c87._6_1_ = '-';
    uRam00000000001f3c87._7_1_ = '-';
    DAT_001f3c70 = '-';
    DAT_001f3c70_1._0_1_ = '-';
    DAT_001f3c70_1._1_1_ = '-';
    DAT_001f3c70_1._2_1_ = '-';
    DAT_001f3c70_1._3_1_ = '-';
    DAT_001f3c70_1._4_1_ = '-';
    DAT_001f3c70_1._5_1_ = '-';
    DAT_001f3c70_1._6_1_ = '-';
    uRam00000000001f3c78 = 0x2d2d2d2d2d2d2d;
    DAT_001f3c7f = 0x2d;
    DAT_001f3c60 = '-';
    DAT_001f3c60_1._0_1_ = '-';
    DAT_001f3c60_1._1_1_ = '-';
    DAT_001f3c60_1._2_1_ = '-';
    DAT_001f3c60_1._3_1_ = '-';
    DAT_001f3c60_1._4_1_ = '-';
    DAT_001f3c60_1._5_1_ = '-';
    DAT_001f3c60_1._6_1_ = '-';
    uRam00000000001f3c68._0_1_ = '-';
    uRam00000000001f3c68._1_1_ = '-';
    uRam00000000001f3c68._2_1_ = '-';
    uRam00000000001f3c68._3_1_ = '-';
    uRam00000000001f3c68._4_1_ = '-';
    uRam00000000001f3c68._5_1_ = '-';
    uRam00000000001f3c68._6_1_ = '-';
    uRam00000000001f3c68._7_1_ = '-';
    DAT_001f3c50 = '-';
    DAT_001f3c50_1._0_1_ = '-';
    DAT_001f3c50_1._1_1_ = '-';
    DAT_001f3c50_1._2_1_ = '-';
    DAT_001f3c50_1._3_1_ = '-';
    DAT_001f3c50_1._4_1_ = '-';
    DAT_001f3c50_1._5_1_ = '-';
    DAT_001f3c50_1._6_1_ = '-';
    uRam00000000001f3c58._0_1_ = '-';
    uRam00000000001f3c58._1_1_ = '-';
    uRam00000000001f3c58._2_1_ = '-';
    uRam00000000001f3c58._3_1_ = '-';
    uRam00000000001f3c58._4_1_ = '-';
    uRam00000000001f3c58._5_1_ = '-';
    uRam00000000001f3c58._6_1_ = '-';
    uRam00000000001f3c58._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001f3c48._0_1_ = '-';
    uRam00000000001f3c48._1_1_ = '-';
    uRam00000000001f3c48._2_1_ = '-';
    uRam00000000001f3c48._3_1_ = '-';
    uRam00000000001f3c48._4_1_ = '-';
    uRam00000000001f3c48._5_1_ = '-';
    uRam00000000001f3c48._6_1_ = '-';
    uRam00000000001f3c48._7_1_ = '-';
    DAT_001f3c8f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  Colour::Colour(&colourGuard,Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}